

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O2

void NULLCCanvas::CanvasClearRGBA(float red,float green,float blue,float alpha,Canvas *ptr)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  
  if (ptr != (Canvas *)0x0) {
    auVar4._4_4_ = green;
    auVar4._0_4_ = red;
    auVar4._12_4_ = alpha;
    auVar4._8_4_ = blue;
    auVar4 = divps(auVar4,_DAT_00323ee0);
    uVar1 = ptr->height * ptr->width;
    uVar3 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
      *(undefined1 (*) [16])((ptr->data).ptr + uVar3) = auVar4;
    }
    return;
  }
  nullcThrowError("ERROR: Canvas object is nullptr");
  return;
}

Assistant:

void CanvasClearRGBA(float red, float green, float blue, float alpha, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		float fRed = red / 255.0f;
		float fGreen = green / 255.0f;
		float fBlue = blue / 255.0f;
		float fAlpha = alpha / 255.0f;
		for(int i = 0; i < ptr->width * ptr->height; i++)
		{
			((float*)ptr->data.ptr)[i * 4 + 0] = fRed;
			((float*)ptr->data.ptr)[i * 4 + 1] = fGreen;
			((float*)ptr->data.ptr)[i * 4 + 2] = fBlue;
			((float*)ptr->data.ptr)[i * 4 + 3] = fAlpha;
		}
	}